

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_connect_convolution.c
# Opt level: O1

rt_function_error_t allocate_binary_connect_convolution_local_context(rt_function_t *f)

{
  rt_function_error_t rVar1;
  long lVar2;
  
  f->exec_func = exec_binary_connect_convolution;
  if (0 < (long)f->num_of_inputs) {
    lVar2 = 0;
    do {
      if ((f->inputs[lVar2]->field_0x10 & 0xf) != 0) {
        f->exec_func = exec_convolution_generic;
        break;
      }
      lVar2 = lVar2 + 1;
    } while (f->num_of_inputs != lVar2);
  }
  if (((*f->outputs)->field_0x10 & 0xf) != 0) {
    f->exec_func = exec_convolution_generic;
  }
  rVar1 = allocate_convolution_local_context_common(f,0,2,3,-1,0);
  return rVar1;
}

Assistant:

rt_function_error_t
allocate_binary_connect_convolution_local_context(rt_function_t *f) {
  assert(sizeof(convolution_local_context_t) ==
         sizeof(binary_connect_convolution_local_context_t));

#ifdef CONFIG_BINARYCONNECTCONVOLUTION_FLOAT32
  f->exec_func = exec_binary_connect_convolution;
#endif /* CONFIG_BINARYCONNECTCONVOLUTION_FLOAT32 */

#ifdef CONFIG_BINARYCONNECTCONVOLUTION_GENERIC
  for (int i = 0; i < f->num_of_inputs; i++) {
    if (f->inputs[i]->type != NN_DATA_TYPE_FLOAT) {
      f->exec_func = exec_convolution_generic;
      break;
    }
  }
  if (f->outputs[0]->type != NN_DATA_TYPE_FLOAT) {
    f->exec_func = exec_convolution_generic;
  }
#endif /* CONFIG_BINARYCONNECTCONVOLUTION_GENERIC */
  return allocate_convolution_local_context_common(f, X, WEIGHT, BIAS, ALPHA,
                                                   Y0);
}